

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void check_trust_status(Terminal *term,termline *line)

{
  if (line->trusted != term->trusted) {
    clear_line(term,line);
    line->trusted = term->trusted;
  }
  return;
}

Assistant:

static void check_trust_status(Terminal *term, termline *line)
{
    if (line->trusted != term->trusted) {
        /*
         * If we're displaying trusted output on a previously
         * untrusted line, or vice versa, we need to switch the
         * 'trusted' attribute on this terminal line, and also clear
         * all its previous contents.
         */
        clear_line(term, line);
        line->trusted = term->trusted;
    }
}